

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_map.h
# Opt level: O0

iterator __thiscall
ctemplate::
small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
::find(small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
       *this,key_type *key)

{
  bool bVar1;
  pair<const_unsigned_long,_ctemplate::TemplateString> *__x;
  map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>
  *this_00;
  iterator local_38;
  int local_30;
  equal_to<unsigned_long> local_29;
  int i;
  key_equal compare;
  key_type *key_local;
  small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>
  *this_local;
  
  _i = key;
  if (this->size_ < 0) {
    this_00 = map(this);
    local_38 = std::
               map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>
               ::find(this_00,_i);
    iterator::iterator((iterator *)&this_local,&local_38);
  }
  else {
    for (local_30 = 0; local_30 < this->size_; local_30 = local_30 + 1) {
      __x = ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>::
            operator->((ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>
                        *)((long)&this->field_2 + (long)local_30 * 0x28));
      bVar1 = std::equal_to<unsigned_long>::operator()(&local_29,&__x->first,_i);
      if (bVar1) {
        iterator::iterator((iterator *)&this_local,
                           (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>
                            *)((long)&this->field_2 + (long)local_30 * 0x28));
        return _this_local;
      }
    }
    iterator::iterator((iterator *)&this_local,
                       (ManualConstructor<std::pair<const_unsigned_long,_ctemplate::TemplateString>_>
                        *)((long)&this->field_2 + (long)this->size_ * 0x28));
  }
  return _this_local;
}

Assistant:

iterator find(const key_type& key) {
    key_equal compare;
    if (size_ >= 0) {
      for (int i = 0; i < size_; i++) {
        if (compare(array_[i]->first, key)) {
          return iterator(array_ + i);
        }
      }
      return iterator(array_ + size_);
    } else {
      return iterator(map()->find(key));
    }
  }